

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetA.c
# Opt level: O3

void scalar_rwnaf(int8_t *out,uchar *in)

{
  int8_t iVar1;
  uint uVar2;
  char cVar3;
  long lVar4;
  int8_t *piVar5;
  uint uVar6;
  
  uVar2 = (uint)(byte)((*in & 0x3e) + 1);
  lVar4 = 0;
  piVar5 = out;
  do {
    cVar3 = ((byte)uVar2 & 0x3f) - 0x20;
    *piVar5 = cVar3;
    uVar2 = (int)(char)(byte)uVar2 - (int)cVar3;
    uVar6 = (uint)(in[lVar4 + 6U >> 3 & 0x1fffffff] >> ((byte)(lVar4 + 6U) & 7));
    if (lVar4 == 0x1f9) {
      iVar1 = (int8_t)((uVar2 & 0xffffffe0) * 0x80000 + (uVar6 & 1) * 0x2000000 >> 0x18);
      break;
    }
    uVar2 = ((in[lVar4 + 9U >> 3 & 0x1fffffff] >> ((byte)(lVar4 + 9U) & 7) & 1) * 0x10000000 +
             (in[lVar4 + 8U >> 3 & 0x1fffffff] >> ((byte)(lVar4 + 8U) & 7) & 1) * 0x8000000 +
             (in[lVar4 + 7U >> 3 & 0x1fffffff] >> ((byte)(lVar4 + 7U) & 7) & 1) * 0x4000000 +
             (uVar2 & 0xffffffe0) * 0x80000 + (uVar6 & 1) * 0x2000000 >> 0x18) +
            (in[lVar4 + 10U >> 3 & 0x1fffffff] >> ((byte)(lVar4 + 10U) & 7) & 1) * 0x20;
    iVar1 = (int8_t)uVar2;
    piVar5 = piVar5 + 1;
    lVar4 = lVar4 + 5;
  } while (lVar4 != 0x1fe);
  out[0x66] = iVar1;
  return;
}

Assistant:

static void scalar_rwnaf(int8_t out[103], const unsigned char in[64]) {
    int i;
    int8_t window, d;

    window = (in[0] & (DRADIX_WNAF - 1)) | 1;
    for (i = 0; i < 102; i++) {
        d = (window & (DRADIX_WNAF - 1)) - DRADIX;
        out[i] = d;
        window = (window - d) >> RADIX;
        window += scalar_get_bit(in, (i + 1) * RADIX + 1) << 1;
        window += scalar_get_bit(in, (i + 1) * RADIX + 2) << 2;
        window += scalar_get_bit(in, (i + 1) * RADIX + 3) << 3;
        window += scalar_get_bit(in, (i + 1) * RADIX + 4) << 4;
        window += scalar_get_bit(in, (i + 1) * RADIX + 5) << 5;
    }
    out[i] = window;
}